

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearUpdateVecs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  cpp_dec_float<50U,_int,_void> *pcVar2;
  
  pUVar1 = this->theFvec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&pUVar1->thedelta);
  (pUVar1->theval).m_backend.fpclass = cpp_dec_float_finite;
  (pUVar1->theval).m_backend.prec_elem = 10;
  (pUVar1->theval).m_backend.data._M_elems[0] = 0;
  (pUVar1->theval).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x25) = 0;
  pUVar1 = this->thePvec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&pUVar1->thedelta);
  (pUVar1->theval).m_backend.fpclass = cpp_dec_float_finite;
  (pUVar1->theval).m_backend.prec_elem = 10;
  (pUVar1->theval).m_backend.data._M_elems[0] = 0;
  (pUVar1->theval).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x25) = 0;
  pUVar1 = this->theCoPvec;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&pUVar1->thedelta);
  (pUVar1->theval).m_backend.fpclass = cpp_dec_float_finite;
  (pUVar1->theval).m_backend.prec_elem = 10;
  (pUVar1->theval).m_backend.data._M_elems[0] = 0;
  (pUVar1->theval).m_backend.data._M_elems[1] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[2] = 0;
  (pcVar2->data)._M_elems[3] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[4] = 0;
  (pcVar2->data)._M_elems[5] = 0;
  pcVar2 = &(pUVar1->theval).m_backend;
  (pcVar2->data)._M_elems[6] = 0;
  (pcVar2->data)._M_elems[7] = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(pUVar1->theval).m_backend.data._M_elems + 0x25) = 0;
  this->solveVector2 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->solveVector3 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->coSolveVector2 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->coSolveVector3 =
       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  return;
}

Assistant:

void SPxSolverBase<R>::clearUpdateVecs(void)
   {
      theFvec->clearUpdate();
      thePvec->clearUpdate();
      theCoPvec->clearUpdate();
      solveVector2 = nullptr;
      solveVector3 = nullptr;
      coSolveVector2 = nullptr;
      coSolveVector3 = nullptr;
   }